

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O2

bool embree::sse42::InstanceArrayIntersector1::occluded
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  RTCFormat RVar3;
  InstanceArray *this;
  RTCRayQueryContext *pRVar4;
  RawBufferView *pRVar5;
  char *pcVar6;
  bool bVar7;
  Accel *pAVar8;
  long lVar9;
  ulong i;
  uint auVar10 [1];
  float fVar11;
  uint auVar19 [1];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar17;
  undefined1 auVar18 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar21 [16];
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar30;
  undefined1 in_XMM4 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar31;
  undefined1 auVar32 [12];
  undefined1 in_XMM5 [16];
  undefined1 auVar33 [16];
  float fVar35;
  float fVar36;
  float fVar37;
  undefined1 auVar34 [16];
  float fVar38;
  float fVar39;
  undefined1 in_XMM7 [16];
  vfloat4 a0;
  float fVar40;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  vfloat4 l02;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar50;
  undefined1 auVar45 [16];
  undefined1 auVar51 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar52 [16];
  undefined1 in_XMM12 [16];
  float fVar53;
  float fVar54;
  RayQueryContext newcontext;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  RTCRayQueryContext RVar12;
  undefined1 auVar20 [16];
  
  auVar32 = in_XMM5._0_12_;
  this = (InstanceArray *)(context->scene->geometries).items[prim->instID_].ptr;
  pAVar8 = InstanceArray::getObject(this,(ulong)prim->primID_);
  if (((pAVar8 == (Accel *)0x0) || ((ray->mask & (this->super_Geometry).mask) == 0)) ||
     (pRVar4 = context->user, pRVar4->instID[0] != 0xffffffff)) {
    bVar7 = false;
  }
  else {
    auVar10[0] = (*prim).primID_;
    auVar19[0] = (*prim).instID_;
    RVar12.instPrimID[0] = auVar10[0];
    RVar12.instID[0] = auVar19[0];
    auVar14._8_8_ = 0;
    auVar14._0_4_ = (float)auVar19[0];
    auVar14._4_4_ = (float)auVar10[0];
    *pRVar4 = RVar12;
    i = (ulong)prim->primID_;
    pRVar5 = (this->l2w_buf).items;
    RVar3 = pRVar5->format;
    if ((this->super_Geometry).field_8.field_0x1 == '\x01') {
      if (RVar3 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar6 = pRVar5->ptr_ofs;
        lVar9 = pRVar5->stride * i;
        auVar14 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar9)),*(undefined4 *)(pcVar6 + lVar9 + 0x10)
                           ,0x1c);
        auVar14 = insertps(auVar14,*(undefined4 *)(pcVar6 + lVar9 + 0x20),0x28);
        auVar29 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar9 + 4)),
                           *(undefined4 *)(pcVar6 + lVar9 + 0x14),0x1c);
        in_XMM12 = insertps(auVar29,*(undefined4 *)(pcVar6 + lVar9 + 0x24),0x28);
        auVar29 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar9 + 8)),
                           *(undefined4 *)(pcVar6 + lVar9 + 0x18),0x1c);
        in_XMM11 = insertps(auVar29,*(undefined4 *)(pcVar6 + lVar9 + 0x28),0x28);
        auVar29 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar9 + 0xc)),
                           *(undefined4 *)(pcVar6 + lVar9 + 0x1c),0x1c);
        in_XMM1 = insertps(auVar29,*(undefined4 *)(pcVar6 + lVar9 + 0x2c),0x28);
      }
      else if (RVar3 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
        pcVar6 = pRVar5->ptr_ofs;
        lVar9 = pRVar5->stride * i;
        auVar14._4_4_ = (float)(int)*(undefined8 *)(pcVar6 + lVar9 + 4);
        auVar14._0_4_ = (float)*(undefined4 *)(pcVar6 + lVar9);
        auVar14._8_4_ = (float)(int)((ulong)*(undefined8 *)(pcVar6 + lVar9 + 4) >> 0x20);
        auVar14._12_4_ = 0.0;
        in_XMM12._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar9 + 0x10);
        in_XMM12._0_4_ = *(undefined4 *)(pcVar6 + lVar9 + 0xc);
        in_XMM12._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar9 + 0x10) >> 0x20);
        in_XMM12._12_4_ = 0;
        in_XMM11._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar9 + 0x1c);
        in_XMM11._0_4_ = *(undefined4 *)(pcVar6 + lVar9 + 0x18);
        in_XMM11._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar9 + 0x1c) >> 0x20);
        in_XMM11._12_4_ = 0;
        in_XMM1._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar9 + 0x28);
        in_XMM1._0_4_ = *(undefined4 *)(pcVar6 + lVar9 + 0x24);
        in_XMM1._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar9 + 0x28) >> 0x20);
        in_XMM1._12_4_ = 0;
      }
      else if (RVar3 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
        pcVar6 = pRVar5->ptr_ofs;
        lVar9 = pRVar5->stride * i;
        auVar52._8_8_ = 0;
        auVar52._0_8_ = *(ulong *)(pcVar6 + lVar9 + 0x10);
        auVar52 = insertps(auVar52,*(undefined4 *)(pcVar6 + lVar9 + 8),0x20);
        auVar29._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar9 + 0x34);
        auVar29._0_4_ = *(undefined4 *)(pcVar6 + lVar9);
        auVar29._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar9 + 0x34) >> 0x20);
        auVar29._12_4_ = 0;
        auVar44._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar9 + 0x1c);
        auVar44._0_4_ = *(undefined4 *)(pcVar6 + lVar9 + 0x18);
        auVar44._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar9 + 0x1c) >> 0x20);
        auVar44._12_4_ = 0;
        fVar11 = *(float *)(pcVar6 + lVar9 + 0x24);
        fVar26 = *(float *)(pcVar6 + lVar9 + 0x28);
        fVar31 = *(float *)(pcVar6 + lVar9 + 0x2c);
        fVar23 = *(float *)(pcVar6 + lVar9 + 0x30);
        fVar24 = fVar23 * fVar23 + fVar31 * fVar31 + fVar11 * fVar11 + fVar26 * fVar26;
        auVar14 = rsqrtss(ZEXT416((uint)fVar24),ZEXT416((uint)fVar24));
        fVar22 = auVar14._0_4_;
        auVar45._4_12_ = auVar14._4_12_;
        fVar22 = fVar22 * fVar22 * fVar24 * -0.5 * fVar22 + fVar22 * 1.5;
        in_XMM1 = insertps(auVar44,ZEXT416((uint)(fVar11 * fVar22)),0x30);
        auVar14 = insertps(auVar29,ZEXT416((uint)(fVar26 * fVar22)),0x30);
        auVar45._0_4_ = fVar22 * fVar23;
        auVar29 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar9 + 0xc)),
                           *(undefined4 *)(pcVar6 + lVar9 + 4),0x10);
        in_XMM11 = insertps(auVar52,auVar45,0x30);
        auVar29 = insertps(auVar29,*(undefined4 *)(pcVar6 + lVar9 + 0x3c),0x20);
        in_XMM12 = insertps(auVar29,ZEXT416((uint)(fVar31 * fVar22)),0x30);
      }
      else if (RVar3 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
        pcVar6 = pRVar5->ptr_ofs;
        lVar9 = pRVar5->stride * i;
        auVar14 = *(undefined1 (*) [16])(pcVar6 + lVar9);
        in_XMM12 = *(undefined1 (*) [16])(pcVar6 + lVar9 + 0x10);
        in_XMM11 = *(undefined1 (*) [16])(pcVar6 + lVar9 + 0x20);
        in_XMM1 = *(undefined1 (*) [16])(pcVar6 + lVar9 + 0x30);
      }
      fVar31 = in_XMM1._12_4_;
      fVar11 = auVar14._0_4_;
      fVar26 = auVar14._12_4_;
      fVar38 = in_XMM12._0_4_;
      fVar40 = in_XMM12._4_4_;
      fVar39 = in_XMM12._12_4_;
      fVar37 = in_XMM11._8_4_;
      fVar25 = in_XMM11._12_4_;
      fVar24 = fVar26 * fVar39 + fVar25 * fVar31;
      fVar23 = fVar26 * fVar39 - fVar25 * fVar31;
      fVar22 = fVar31 * fVar31 + fVar26 * fVar26 + -fVar39 * fVar39 + -fVar25 * fVar25;
      fVar53 = fVar31 * fVar31 - fVar26 * fVar26;
      fVar36 = fVar39 * fVar39 + fVar53 + -fVar25 * fVar25;
      fVar54 = fVar26 * fVar25 - fVar39 * fVar31;
      fVar35 = fVar39 * fVar31 + fVar26 * fVar25;
      fVar30 = fVar39 * fVar25 + fVar26 * fVar31;
      fVar26 = fVar39 * fVar25 - fVar26 * fVar31;
      fVar24 = fVar24 + fVar24;
      fVar54 = fVar54 + fVar54;
      fVar31 = fVar25 * fVar25 + fVar53 + -fVar39 * fVar39;
      fVar53 = fVar22 * 1.0 + fVar24 * 0.0 + fVar54 * 0.0;
      fVar47 = fVar22 * 0.0 + fVar24 * 1.0 + fVar54 * 0.0;
      fVar49 = fVar22 * 0.0 + fVar24 * 0.0 + fVar54 * 1.0;
      fVar54 = fVar22 * 0.0 + fVar24 * 0.0 + fVar54 * 0.0;
      fVar30 = fVar30 + fVar30;
      fVar23 = fVar23 + fVar23;
      fVar22 = fVar23 * 1.0 + fVar36 * 0.0 + fVar30 * 0.0;
      fVar24 = fVar23 * 0.0 + fVar36 * 1.0 + fVar30 * 0.0;
      fVar25 = fVar23 * 0.0 + fVar36 * 0.0 + fVar30 * 1.0;
      fVar23 = fVar23 * 0.0 + fVar36 * 0.0 + fVar30 * 0.0;
      auVar51._0_8_ = auVar14._4_8_;
      auVar51._8_8_ = 0;
      auVar29 = blendps(auVar51,in_XMM12,4);
      fVar35 = fVar35 + fVar35;
      fVar26 = fVar26 + fVar26;
      fVar36 = fVar35 * 1.0 + fVar26 * 0.0 + fVar31 * 0.0;
      fVar30 = fVar35 * 0.0 + fVar26 * 1.0 + fVar31 * 0.0;
      fVar39 = fVar35 * 0.0 + fVar26 * 0.0 + fVar31 * 1.0;
      fVar31 = fVar35 * 0.0 + fVar26 * 0.0 + fVar31 * 0.0;
      local_a8._0_4_ = in_XMM1._0_4_;
      local_a8._4_4_ = in_XMM1._4_4_;
      uStack_a0._0_4_ = in_XMM1._8_4_;
      fVar26 = fVar31 * 0.0;
      auVar14._0_4_ = fVar11 * fVar53 + fVar22 * 0.0 + fVar36 * 0.0;
      auVar14._4_4_ = fVar11 * fVar47 + fVar24 * 0.0 + fVar30 * 0.0;
      auVar14._8_4_ = fVar11 * fVar49 + fVar25 * 0.0 + fVar39 * 0.0;
      auVar14._12_4_ = fVar11 * fVar54 + fVar23 * 0.0 + fVar26;
      in_XMM7._0_4_ = fVar38 * fVar53 + fVar40 * fVar22 + fVar36 * 0.0;
      in_XMM7._4_4_ = fVar38 * fVar47 + fVar40 * fVar24 + fVar30 * 0.0;
      in_XMM7._8_4_ = fVar38 * fVar49 + fVar40 * fVar25 + fVar39 * 0.0;
      in_XMM7._12_4_ = fVar38 * fVar54 + fVar40 * fVar23 + fVar26;
      fVar26 = in_XMM11._4_4_;
      fVar11 = in_XMM11._0_4_;
      in_XMM4._0_4_ = fVar11 * fVar53 + fVar26 * fVar22 + fVar37 * fVar36;
      in_XMM4._4_4_ = fVar11 * fVar47 + fVar26 * fVar24 + fVar37 * fVar30;
      in_XMM4._8_4_ = fVar11 * fVar49 + fVar26 * fVar25 + fVar37 * fVar39;
      in_XMM4._12_4_ = fVar11 * fVar54 + fVar26 * fVar23 + fVar37 * fVar31;
      auVar32._0_4_ =
           (float)local_a8 * fVar53 + local_a8._4_4_ * fVar22 + (float)uStack_a0 * fVar36 +
           auVar29._0_4_ + 0.0;
      auVar32._4_4_ =
           (float)local_a8 * fVar47 + local_a8._4_4_ * fVar24 + (float)uStack_a0 * fVar30 +
           auVar29._4_4_ + 0.0;
      auVar32._8_4_ =
           (float)local_a8 * fVar49 + local_a8._4_4_ * fVar25 + (float)uStack_a0 * fVar39 +
           auVar29._8_4_ + 0.0;
    }
    else if (RVar3 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
      pcVar6 = pRVar5->ptr_ofs;
      lVar9 = pRVar5->stride * i;
      auVar14 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar9)),*(undefined4 *)(pcVar6 + lVar9 + 0x10),
                         0x1c);
      auVar14 = insertps(auVar14,*(undefined4 *)(pcVar6 + lVar9 + 0x20),0x28);
      auVar29 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar9 + 4)),
                         *(undefined4 *)(pcVar6 + lVar9 + 0x14),0x1c);
      in_XMM7 = insertps(auVar29,*(undefined4 *)(pcVar6 + lVar9 + 0x24),0x28);
      auVar29 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar9 + 8)),
                         *(undefined4 *)(pcVar6 + lVar9 + 0x18),0x1c);
      in_XMM4 = insertps(auVar29,*(undefined4 *)(pcVar6 + lVar9 + 0x28),0x28);
      auVar29 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar9 + 0xc)),
                         *(undefined4 *)(pcVar6 + lVar9 + 0x1c),0x1c);
      auVar29 = insertps(auVar29,*(undefined4 *)(pcVar6 + lVar9 + 0x2c),0x28);
      auVar32 = auVar29._0_12_;
    }
    else if (RVar3 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
      pcVar6 = pRVar5->ptr_ofs;
      lVar9 = pRVar5->stride * i;
      auVar14._4_4_ = (float)(int)*(undefined8 *)(pcVar6 + lVar9 + 4);
      auVar14._0_4_ = (float)*(undefined4 *)(pcVar6 + lVar9);
      auVar14._8_4_ = (float)(int)((ulong)*(undefined8 *)(pcVar6 + lVar9 + 4) >> 0x20);
      auVar14._12_4_ = 0.0;
      in_XMM7._4_4_ = (float)(int)*(undefined8 *)(pcVar6 + lVar9 + 0x10);
      in_XMM7._0_4_ = (float)*(undefined4 *)(pcVar6 + lVar9 + 0xc);
      in_XMM7._8_4_ = (float)(int)((ulong)*(undefined8 *)(pcVar6 + lVar9 + 0x10) >> 0x20);
      in_XMM7._12_4_ = 0.0;
      in_XMM4._4_4_ = (float)(int)*(undefined8 *)(pcVar6 + lVar9 + 0x1c);
      in_XMM4._0_4_ = (float)*(undefined4 *)(pcVar6 + lVar9 + 0x18);
      in_XMM4._8_4_ = (float)(int)((ulong)*(undefined8 *)(pcVar6 + lVar9 + 0x1c) >> 0x20);
      in_XMM4._12_4_ = 0.0;
      auVar32._4_4_ = (float)(int)*(undefined8 *)(pcVar6 + lVar9 + 0x28);
      auVar32._0_4_ = (float)*(undefined4 *)(pcVar6 + lVar9 + 0x24);
      auVar32._8_4_ = (float)(int)((ulong)*(undefined8 *)(pcVar6 + lVar9 + 0x28) >> 0x20);
    }
    else if (RVar3 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
      pcVar6 = pRVar5->ptr_ofs;
      lVar9 = pRVar5->stride * i;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = *(ulong *)(pcVar6 + lVar9 + 0x10);
      auVar29 = insertps(auVar27,*(undefined4 *)(pcVar6 + lVar9 + 8),0x20);
      auVar13._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar9 + 0x34);
      auVar13._0_4_ = *(undefined4 *)(pcVar6 + lVar9);
      auVar13._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar9 + 0x34) >> 0x20);
      auVar13._12_4_ = 0;
      auVar33._4_4_ = (int)*(undefined8 *)(pcVar6 + lVar9 + 0x1c);
      auVar33._0_4_ = *(undefined4 *)(pcVar6 + lVar9 + 0x18);
      auVar33._8_4_ = (int)((ulong)*(undefined8 *)(pcVar6 + lVar9 + 0x1c) >> 0x20);
      auVar33._12_4_ = 0;
      fVar11 = *(float *)(pcVar6 + lVar9 + 0x24);
      fVar26 = *(float *)(pcVar6 + lVar9 + 0x28);
      fVar31 = *(float *)(pcVar6 + lVar9 + 0x2c);
      fVar23 = *(float *)(pcVar6 + lVar9 + 0x30);
      fVar24 = fVar23 * fVar23 + fVar31 * fVar31 + fVar11 * fVar11 + fVar26 * fVar26;
      auVar14 = rsqrtss(ZEXT416((uint)fVar24),ZEXT416((uint)fVar24));
      fVar22 = auVar14._0_4_;
      auVar41._4_12_ = auVar14._4_12_;
      fVar22 = fVar22 * fVar22 * fVar24 * -0.5 * fVar22 + fVar22 * 1.5;
      auVar14 = insertps(auVar33,ZEXT416((uint)(fVar11 * fVar22)),0x30);
      auVar32 = auVar14._0_12_;
      auVar14 = insertps(auVar13,ZEXT416((uint)(fVar26 * fVar22)),0x30);
      auVar41._0_4_ = fVar22 * fVar23;
      auVar44 = insertps(ZEXT416(*(uint *)(pcVar6 + lVar9 + 0xc)),
                         *(undefined4 *)(pcVar6 + lVar9 + 4),0x10);
      in_XMM4 = insertps(auVar29,auVar41,0x30);
      auVar29 = insertps(auVar44,*(undefined4 *)(pcVar6 + lVar9 + 0x3c),0x20);
      in_XMM7 = insertps(auVar29,ZEXT416((uint)(fVar31 * fVar22)),0x30);
    }
    else if (RVar3 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
      pcVar6 = pRVar5->ptr_ofs;
      lVar9 = pRVar5->stride * i;
      auVar14 = *(undefined1 (*) [16])(pcVar6 + lVar9);
      in_XMM7 = *(undefined1 (*) [16])(pcVar6 + lVar9 + 0x10);
      in_XMM4 = *(undefined1 (*) [16])(pcVar6 + lVar9 + 0x20);
      auVar32 = SUB1612(*(undefined1 (*) [16])(pcVar6 + lVar9 + 0x30),0);
    }
    fVar23 = in_XMM4._0_4_;
    fVar22 = in_XMM4._4_4_;
    fVar24 = in_XMM4._8_4_;
    fVar25 = in_XMM4._12_4_;
    fVar30 = in_XMM7._0_4_;
    fVar39 = in_XMM7._4_4_;
    fVar53 = in_XMM7._8_4_;
    fVar11 = auVar14._0_4_;
    fVar26 = auVar14._4_4_;
    fVar31 = auVar14._8_4_;
    auVar34._0_4_ = fVar30 * fVar22 - fVar39 * fVar23;
    fVar35 = fVar39 * fVar24 - fVar53 * fVar22;
    fVar36 = fVar53 * fVar23 - fVar30 * fVar24;
    auVar42._4_4_ = fVar36;
    auVar42._0_4_ = fVar35;
    auVar42._8_4_ = auVar34._0_4_;
    auVar42._12_4_ = in_XMM7._12_4_ * fVar25 - in_XMM7._12_4_ * fVar25;
    auVar28._0_4_ = fVar23 * fVar26 - fVar22 * fVar11;
    auVar28._4_4_ = fVar22 * fVar31 - fVar24 * fVar26;
    auVar28._8_4_ = fVar24 * fVar11 - fVar23 * fVar31;
    auVar28._12_4_ = fVar25 * auVar14._12_4_ - fVar25 * auVar14._12_4_;
    fVar23 = fVar26 * fVar53 - fVar31 * fVar39;
    auVar14 = dpps(auVar14,auVar42,0x7f);
    auVar21._4_4_ = fVar23;
    auVar21._0_4_ = fVar35;
    auVar29 = insertps(auVar28,auVar28,0x4a);
    auVar34._4_4_ = auVar28._0_4_;
    auVar34._8_4_ = fVar11 * fVar39 - fVar26 * fVar30;
    auVar34._12_4_ = 0;
    auVar21._8_4_ = fVar23;
    auVar21._12_4_ = auVar29._4_4_;
    auVar20._8_8_ = auVar21._8_8_;
    auVar20._4_4_ = auVar29._0_4_;
    auVar20._0_4_ = fVar35;
    auVar43._4_4_ = auVar29._8_4_;
    auVar43._0_4_ = fVar36;
    auVar43._8_4_ = fVar31 * fVar30 - fVar11 * fVar53;
    auVar43._12_4_ = auVar29._12_4_;
    auVar15._0_4_ = auVar14._0_4_;
    auVar15._4_4_ = auVar15._0_4_;
    auVar15._8_4_ = auVar15._0_4_;
    auVar15._12_4_ = auVar15._0_4_;
    auVar14 = divps(auVar20,auVar15);
    auVar44 = divps(auVar43,auVar15);
    auVar29 = divps(auVar34,auVar15);
    fVar39 = auVar32._0_4_;
    fVar53 = auVar32._4_4_;
    fVar47 = auVar32._8_4_;
    fVar49 = auVar29._0_4_;
    fVar54 = auVar29._4_4_;
    fVar37 = auVar29._8_4_;
    fVar38 = auVar29._12_4_;
    fVar40 = auVar44._0_4_;
    fVar46 = auVar44._4_4_;
    fVar48 = auVar44._8_4_;
    fVar50 = auVar44._12_4_;
    fVar11 = auVar14._0_4_;
    fVar26 = auVar14._4_4_;
    fVar31 = auVar14._8_4_;
    fVar23 = auVar14._12_4_;
    pAVar8 = InstanceArray::getObject(this,i);
    aVar1 = (ray->org).field_0.field_1;
    fVar22 = aVar1.x;
    fVar24 = aVar1.y;
    fVar25 = aVar1.z;
    aVar2 = (ray->dir).field_0.field_1;
    fVar35 = aVar2.x;
    fVar36 = aVar2.y;
    fVar30 = aVar2.z;
    auVar16._0_4_ =
         fVar22 * fVar11 +
         fVar24 * fVar40 + (fVar25 * fVar49 - (fVar39 * fVar11 + fVar53 * fVar40 + fVar47 * fVar49))
    ;
    auVar16._4_4_ =
         fVar22 * fVar26 +
         fVar24 * fVar46 + (fVar25 * fVar54 - (fVar39 * fVar26 + fVar53 * fVar46 + fVar47 * fVar54))
    ;
    auVar16._8_4_ =
         fVar22 * fVar31 +
         fVar24 * fVar48 + (fVar25 * fVar37 - (fVar39 * fVar31 + fVar53 * fVar48 + fVar47 * fVar37))
    ;
    auVar16._12_4_ =
         fVar22 * fVar23 +
         fVar24 * fVar50 + (fVar25 * fVar38 - (fVar39 * fVar23 + fVar53 * fVar50 + fVar47 * fVar38))
    ;
    aVar17.field_1 =
         (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
         blendps(auVar16,aVar1,8);
    (ray->org).field_0 = aVar17;
    auVar18._0_4_ = fVar35 * fVar11 + fVar36 * fVar40 + fVar30 * fVar49;
    auVar18._4_4_ = fVar35 * fVar26 + fVar36 * fVar46 + fVar30 * fVar54;
    auVar18._8_4_ = fVar35 * fVar31 + fVar36 * fVar48 + fVar30 * fVar37;
    auVar18._12_4_ = fVar35 * fVar23 + fVar36 * fVar50 + fVar30 * fVar38;
    aVar17.field_1 =
         (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
         blendps(auVar18,aVar2,8);
    (ray->dir).field_0 = aVar17;
    (**(code **)&pAVar8->field_0x80)(&(pAVar8->super_AccelData).field_0x58,ray);
    local_a8 = aVar1._0_8_;
    uStack_a0 = aVar1._8_8_;
    *(undefined8 *)&(ray->org).field_0 = local_a8;
    *(undefined8 *)((long)&(ray->org).field_0 + 8) = uStack_a0;
    local_98 = aVar2._0_8_;
    uStack_90 = aVar2._8_8_;
    *(undefined8 *)&(ray->dir).field_0 = local_98;
    *(undefined8 *)((long)&(ray->dir).field_0 + 8) = uStack_90;
    bVar7 = ray->tfar <= 0.0 && ray->tfar != 0.0;
    pRVar4->instID[0] = 0xffffffff;
    pRVar4->instPrimID[0] = 0xffffffff;
  }
  return bVar7;
}

Assistant:

bool InstanceArrayIntersector1::occluded(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
    {
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return false;
      
      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      if ((ray.mask & instance->mask) == 0) 
        return false;
#endif
      
      RTCRayQueryContext* user_context = context->user;
      bool occluded = false;
      if (likely(instance_id_stack::push(user_context, prim.instID_, prim.primID_)))
      {
        const AffineSpace3fa world2local = instance->getWorld2Local(prim.primID_);
        Accel* object = instance->getObject(prim.primID_);
        const Vec3ff ray_org = ray.org;
        const Vec3ff ray_dir = ray.dir;
        ray.org = Vec3ff(xfmPoint(world2local, ray_org), ray.tnear());
        ray.dir = Vec3ff(xfmVector(world2local, ray_dir), ray.time());
        RayQueryContext newcontext((Scene*)object, user_context, context->args);
        object->intersectors.occluded((RTCRay&)ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        occluded = ray.tfar < 0.0f;
        instance_id_stack::pop(user_context);
      }
      return occluded;
    }